

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::BuildBLAS(DeviceContextVkImpl *this,BuildBLASAttribs *Attribs)

{
  BLASBuildBoundingBoxData *pBVar1;
  BLASTriangleDesc *pBVar2;
  ulong uVar3;
  Uint64 UVar4;
  undefined4 uVar5;
  VkGeometryFlagsKHR VVar6;
  VkFormat VVar7;
  Uint32 UVar8;
  VkIndexType VVar9;
  BottomLevelASVkImpl *BLAS;
  BufferVkImpl *Buffer;
  BottomLevelASDesc *pBVar10;
  BLASBuildTriangleData *pBVar11;
  Char *pCVar12;
  reference pvVar13;
  reference pvVar14;
  BufferVkImpl *this_00;
  VkDeviceAddress VVar15;
  RenderDeviceVkImpl *this_01;
  VulkanPhysicalDevice *this_02;
  ExtensionProperties *pEVar16;
  undefined1 local_258 [8];
  string msg_7;
  VkPhysicalDeviceAccelerationStructurePropertiesKHR *ASLimits;
  VkAccelerationStructureBuildRangeInfoKHR *VkRangePtr;
  string msg_6;
  BufferVkImpl *pBB;
  VkAccelerationStructureBuildRangeInfoKHR *off_1;
  VkAccelerationStructureGeometryAabbsDataKHR *vkAABBs;
  VkAccelerationStructureGeometryKHR *vkGeo_1;
  string msg_5;
  Uint32 GeoIdx_1;
  Uint32 Idx_1;
  BLASBuildBoundingBoxData *SrcBoxes;
  undefined1 local_1b0 [4];
  Uint32 i_1;
  string msg_4;
  BufferVkImpl *pTB;
  string msg_3;
  BufferVkImpl *pIB;
  string msg_2;
  string msg_1;
  BufferVkImpl *pVB;
  BLASTriangleDesc *TriDesc;
  VkAccelerationStructureBuildRangeInfoKHR *off;
  VkAccelerationStructureGeometryTrianglesDataKHR *vkTris;
  VkAccelerationStructureGeometryKHR *vkGeo;
  string msg;
  Uint32 GeoIdx;
  Uint32 Idx;
  BLASBuildTriangleData *SrcTris;
  Uint32 i;
  undefined1 local_b8 [8];
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  vkGeometries;
  vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  vkRanges;
  VkAccelerationStructureBuildGeometryInfoKHR vkASBuildInfo;
  char *OpName;
  BottomLevelASDesc *BLASDesc;
  BufferVkImpl *pScratchVk;
  BottomLevelASVkImpl *pBLASVk;
  BuildBLASAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::BuildBLAS
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  BLAS = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>(Attribs->pBLAS);
  Buffer = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(Attribs->pScratchBuffer);
  pBVar10 = DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
            ::GetDesc((DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                       *)BLAS);
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBLASState
            (this,BLAS,Attribs->BLASTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
  TransitionOrVerifyBufferState
            (this,Buffer,Attribs->ScratchBufferTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR,
             "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
  memset(&vkRanges.
          super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x50);
  std::
  vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ::vector((vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
            *)&vkGeometries.
               super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>::
  vector((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
          *)local_b8);
  if (Attribs->pTriangleData == (BLASBuildTriangleData *)0x0) {
    if (Attribs->pBoxData != (BLASBuildBoundingBoxData *)0x0) {
      std::
      vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ::resize((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                *)local_b8,(ulong)Attribs->BoxDataCount);
      std::
      vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
      ::resize((vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                *)&vkGeometries.
                   super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)Attribs->BoxDataCount);
      BottomLevelASBase<Diligent::EngineVkImplTraits>::SetActualGeometryCount
                (&BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,Attribs->BoxDataCount)
      ;
      for (SrcBoxes._4_4_ = 0; SrcBoxes._4_4_ < Attribs->BoxDataCount;
          SrcBoxes._4_4_ = SrcBoxes._4_4_ + 1) {
        pBVar1 = Attribs->pBoxData + SrcBoxes._4_4_;
        msg_5.field_2._12_4_ = SrcBoxes._4_4_;
        msg_5.field_2._8_4_ =
             BottomLevelASBase<Diligent::EngineVkImplTraits>::UpdateGeometryIndex
                       (&BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,
                        pBVar1->GeometryName,(Uint32 *)(msg_5.field_2._M_local_buf + 0xc),
                        (bool)(Attribs->Update & 1));
        if ((msg_5.field_2._8_4_ == 0xffffffff) || (msg_5.field_2._12_4_ == -1)) {
          FormatString<char[32]>
                    ((string *)&vkGeo_1,(char (*) [32])"Failed to find geometry by name");
          pCVar12 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar12,"BuildBLAS",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xe28);
          std::__cxx11::string::~string((string *)&vkGeo_1);
        }
        else {
          pvVar13 = std::
                    vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ::operator[]((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                                  *)local_b8,(ulong)(uint)msg_5.field_2._12_4_);
          pvVar14 = std::
                    vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                    ::operator[]((vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                                  *)&vkGeometries.
                                     super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)(uint)msg_5.field_2._12_4_);
          pvVar13->sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
          pvVar13->pNext = (void *)0x0;
          VVar6 = GeometryFlagsToVkGeometryFlags(pBVar1->Flags);
          pvVar13->flags = VVar6;
          pvVar13->geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;
          msg_6.field_2._8_8_ =
               ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBVar1->pBoxBuffer);
          (pvVar13->geometry).triangles.sType =
               VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
          (pvVar13->geometry).triangles.pNext = (void *)0x0;
          *(ulong *)((long)&pvVar13->geometry + 0x18) = (ulong)pBVar1->BoxStride;
          VVar15 = BufferVkImpl::GetVkDeviceAddress((BufferVkImpl *)msg_6.field_2._8_8_);
          (pvVar13->geometry).aabbs.data.hostAddress = (void *)(VVar15 + pBVar1->BoxOffset);
          if (((pvVar13->geometry).aabbs.data.deviceAddress & 7) != 0) {
            FormatString<char[43]>
                      ((string *)&VkRangePtr,
                       (char (*) [43])"AABB start address is not properly aligned");
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"BuildBLAS",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xe3c);
            std::__cxx11::string::~string((string *)&VkRangePtr);
          }
          TransitionOrVerifyBufferState
                    (this,(BufferVkImpl *)msg_6.field_2._8_8_,Attribs->GeometryTransitionMode,
                     RESOURCE_STATE_BUILD_AS_READ,VK_ACCESS_SHADER_READ_BIT,
                     "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
          pvVar14->firstVertex = 0;
          pvVar14->transformOffset = 0;
          pvVar14->primitiveOffset = 0;
          pvVar14->primitiveCount = pBVar1->BoxCount;
        }
      }
    }
  }
  else {
    std::
    vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
    ::resize((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
              *)local_b8,(ulong)Attribs->TriangleDataCount);
    std::
    vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
    ::resize((vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
              *)&vkGeometries.
                 super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (ulong)Attribs->TriangleDataCount);
    BottomLevelASBase<Diligent::EngineVkImplTraits>::SetActualGeometryCount
              (&BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,
               Attribs->TriangleDataCount);
    for (SrcTris._0_4_ = 0; (uint)SrcTris < Attribs->TriangleDataCount;
        SrcTris._0_4_ = (uint)SrcTris + 1) {
      pBVar11 = Attribs->pTriangleData + (uint)SrcTris;
      msg.field_2._12_4_ = (uint)SrcTris;
      msg.field_2._8_4_ =
           BottomLevelASBase<Diligent::EngineVkImplTraits>::UpdateGeometryIndex
                     (&BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,
                      pBVar11->GeometryName,(Uint32 *)(msg.field_2._M_local_buf + 0xc),
                      (bool)(Attribs->Update & 1));
      if ((msg.field_2._8_4_ == 0xffffffff) || (msg.field_2._12_4_ == -1)) {
        FormatString<char[32]>((string *)&vkGeo,(char (*) [32])"Failed to find geometry by name");
        pCVar12 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar12,"BuildBLAS",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xdd2);
        std::__cxx11::string::~string((string *)&vkGeo);
      }
      else {
        pvVar13 = std::
                  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                  ::operator[]((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                                *)local_b8,(ulong)(uint)msg.field_2._12_4_);
        pvVar14 = std::
                  vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                  ::operator[]((vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                                *)&vkGeometries.
                                   super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(uint)msg.field_2._12_4_);
        uVar5 = msg.field_2._8_4_;
        pBVar2 = pBVar10->pTriangles;
        pvVar13->sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
        pvVar13->pNext = (void *)0x0;
        VVar6 = GeometryFlagsToVkGeometryFlags(pBVar11->Flags);
        pvVar13->flags = VVar6;
        pvVar13->geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
        (pvVar13->geometry).triangles.sType =
             VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
        (pvVar13->geometry).triangles.pNext = (void *)0x0;
        this_00 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBVar11->pVertexBuffer);
        VVar7 = TypeToVkFormat(pBVar2[(uint)uVar5].VertexValueType,
                               (uint)pBVar2[(uint)uVar5].VertexComponentCount,
                               pBVar2[(uint)uVar5].VertexValueType < VT_FLOAT16);
        (pvVar13->geometry).triangles.vertexFormat = VVar7;
        *(ulong *)((long)&pvVar13->geometry + 0x20) = (ulong)pBVar11->VertexStride;
        if (pBVar11->VertexCount == 0) {
          FormatString<char[36]>
                    ((string *)((long)&msg_2.field_2 + 8),
                     (char (*) [36])"Vertex count must be greater than 0");
          pCVar12 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar12,"BuildBLAS",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xde8);
          std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
        }
        (pvVar13->geometry).triangles.maxVertex = pBVar11->VertexCount - 1;
        VVar15 = BufferVkImpl::GetVkDeviceAddress(this_00);
        (pvVar13->geometry).aabbs.stride = VVar15 + pBVar11->VertexOffset;
        uVar3 = (pvVar13->geometry).aabbs.stride;
        UVar8 = GetValueSize(pBVar2[(uint)uVar5].VertexValueType);
        if (uVar3 % (ulong)UVar8 != 0) {
          FormatString<char[52]>
                    ((string *)&pIB,
                     (char (*) [52])"Vertex buffer start address is not properly aligned");
          pCVar12 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar12,"BuildBLAS",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xded);
          std::__cxx11::string::~string((string *)&pIB);
        }
        TransitionOrVerifyBufferState
                  (this,this_00,Attribs->GeometryTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
                   VK_ACCESS_SHADER_READ_BIT,"Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)")
        ;
        if (pBVar11->pIndexBuffer == (IBuffer *)0x0) {
          (pvVar13->geometry).triangles.indexType = VK_INDEX_TYPE_NONE_KHR;
          (pvVar13->geometry).triangles.indexData.deviceAddress = 0;
        }
        else {
          msg_3.field_2._8_8_ =
               ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBVar11->pIndexBuffer);
          VVar9 = TypeToVkIndexType(pBVar2[(uint)uVar5].IndexType);
          (pvVar13->geometry).triangles.indexType = VVar9;
          VVar15 = BufferVkImpl::GetVkDeviceAddress((BufferVkImpl *)msg_3.field_2._8_8_);
          (pvVar13->geometry).triangles.indexData.hostAddress =
               (void *)(VVar15 + pBVar11->IndexOffset);
          uVar3 = *(ulong *)((long)&pvVar13->geometry + 0x30);
          UVar8 = GetValueSize(pBVar2[(uint)uVar5].IndexType);
          if (uVar3 % (ulong)UVar8 != 0) {
            FormatString<char[51]>
                      ((string *)&pTB,
                       (char (*) [51])"Index buffer start address is not properly aligned");
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"BuildBLAS",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xdfa);
            std::__cxx11::string::~string((string *)&pTB);
          }
          TransitionOrVerifyBufferState
                    (this,(BufferVkImpl *)msg_3.field_2._8_8_,Attribs->GeometryTransitionMode,
                     RESOURCE_STATE_BUILD_AS_READ,VK_ACCESS_SHADER_READ_BIT,
                     "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
        }
        if (pBVar11->pTransformBuffer == (IBuffer *)0x0) {
          (pvVar13->geometry).triangles.transformData.deviceAddress = 0;
        }
        else {
          msg_4.field_2._8_8_ =
               ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBVar11->pTransformBuffer);
          VVar15 = BufferVkImpl::GetVkDeviceAddress((BufferVkImpl *)msg_4.field_2._8_8_);
          (pvVar13->geometry).triangles.transformData.hostAddress =
               (void *)(VVar15 + pBVar11->TransformBufferOffset);
          if (((pvVar13->geometry).triangles.indexData.deviceAddress & 0xf) != 0) {
            FormatString<char[55]>
                      ((string *)local_1b0,
                       (char (*) [55])"Transform buffer start address is not properly aligned");
            pCVar12 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar12,"BuildBLAS",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xe0a);
            std::__cxx11::string::~string((string *)local_1b0);
          }
          TransitionOrVerifyBufferState
                    (this,(BufferVkImpl *)msg_4.field_2._8_8_,Attribs->GeometryTransitionMode,
                     RESOURCE_STATE_BUILD_AS_READ,VK_ACCESS_SHADER_READ_BIT,
                     "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
        }
        pvVar14->primitiveCount = pBVar11->PrimitiveCount;
        pvVar14->firstVertex = 0;
        pvVar14->primitiveOffset = 0;
        pvVar14->transformOffset = 0;
      }
    }
  }
  ASLimits = (VkPhysicalDeviceAccelerationStructurePropertiesKHR *)
             std::
             vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
             ::data((vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                     *)&vkGeometries.
                        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  vkRanges.
  super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3b9d13f0;
  BuildASFlagsToVkBuildAccelerationStructureFlags(pBVar10->Flags);
  if ((Attribs->Update & 1U) != 0) {
    BottomLevelASVkImpl::GetVkBLAS(BLAS);
  }
  BottomLevelASVkImpl::GetVkBLAS(BLAS);
  std::
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>::
  size((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        *)local_b8);
  std::
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>::
  data((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        *)local_b8);
  VVar15 = BufferVkImpl::GetVkDeviceAddress(Buffer);
  UVar4 = Attribs->ScratchBufferOffset;
  this_01 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                      (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                        super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  this_02 = RenderDeviceVkImpl::GetPhysicalDevice(this_01);
  pEVar16 = VulkanUtilities::VulkanPhysicalDevice::GetExtProperties(this_02);
  msg_7.field_2._8_8_ = &pEVar16->AccelStruct;
  if ((VVar15 + UVar4) %
      (ulong)(pEVar16->AccelStruct).minAccelerationStructureScratchOffsetAlignment != 0) {
    FormatString<char[53]>
              ((string *)local_258,
               (char (*) [53])"Scratch buffer start address is not properly aligned");
    pCVar12 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar12,"BuildBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xe55);
    std::__cxx11::string::~string((string *)local_258);
  }
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::BuildAccelerationStructure
            (&this->m_CommandBuffer,1,
             (VkAccelerationStructureBuildGeometryInfoKHR *)
             &vkRanges.
              super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (VkAccelerationStructureBuildRangeInfoKHR **)&ASLimits);
  (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  BottomLevelASBase<Diligent::EngineVkImplTraits>::DvpUpdateVersion
            (&BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
  std::
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>::
  ~vector((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
           *)local_b8);
  std::
  vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ::~vector((vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
             *)&vkGeometries.
                super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void DeviceContextVkImpl::BuildBLAS(const BuildBLASAttribs& Attribs)
{
    TDeviceContextBase::BuildBLAS(Attribs, 0);

    BottomLevelASVkImpl*     pBLASVk    = ClassPtrCast<BottomLevelASVkImpl>(Attribs.pBLAS);
    BufferVkImpl*            pScratchVk = ClassPtrCast<BufferVkImpl>(Attribs.pScratchBuffer);
    const BottomLevelASDesc& BLASDesc   = pBLASVk->GetDesc();

    EnsureVkCmdBuffer();

    const char* OpName = "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)";
    TransitionOrVerifyBLASState(*pBLASVk, Attribs.BLASTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, OpName);
    TransitionOrVerifyBufferState(*pScratchVk, Attribs.ScratchBufferTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR, OpName);

    VkAccelerationStructureBuildGeometryInfoKHR           vkASBuildInfo = {};
    std::vector<VkAccelerationStructureBuildRangeInfoKHR> vkRanges;
    std::vector<VkAccelerationStructureGeometryKHR>       vkGeometries;

    if (Attribs.pTriangleData != nullptr)
    {
        vkGeometries.resize(Attribs.TriangleDataCount);
        vkRanges.resize(Attribs.TriangleDataCount);
        pBLASVk->SetActualGeometryCount(Attribs.TriangleDataCount);

        for (Uint32 i = 0; i < Attribs.TriangleDataCount; ++i)
        {
            const BLASBuildTriangleData& SrcTris = Attribs.pTriangleData[i];

            Uint32 Idx    = i;
            Uint32 GeoIdx = pBLASVk->UpdateGeometryIndex(SrcTris.GeometryName, Idx, Attribs.Update);

            if (GeoIdx == INVALID_INDEX || Idx == INVALID_INDEX)
            {
                UNEXPECTED("Failed to find geometry by name");
                continue;
            }

            VkAccelerationStructureGeometryKHR&              vkGeo   = vkGeometries[Idx];
            VkAccelerationStructureGeometryTrianglesDataKHR& vkTris  = vkGeo.geometry.triangles;
            VkAccelerationStructureBuildRangeInfoKHR&        off     = vkRanges[Idx];
            const BLASTriangleDesc&                          TriDesc = BLASDesc.pTriangles[GeoIdx];

            vkGeo.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
            vkGeo.pNext        = nullptr;
            vkGeo.flags        = GeometryFlagsToVkGeometryFlags(SrcTris.Flags);
            vkGeo.geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
            vkTris.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
            vkTris.pNext       = nullptr;

            BufferVkImpl* const pVB = ClassPtrCast<BufferVkImpl>(SrcTris.pVertexBuffer);

            // vertex format in SrcTris may be undefined, so use vertex format from description
            vkTris.vertexFormat = TypeToVkFormat(TriDesc.VertexValueType, TriDesc.VertexComponentCount, TriDesc.VertexValueType < VT_FLOAT16);
            vkTris.vertexStride = SrcTris.VertexStride;
            // maxVertex is the number of vertices in vertexData minus one.
            VERIFY(SrcTris.VertexCount > 0, "Vertex count must be greater than 0");
            vkTris.maxVertex                = SrcTris.VertexCount - 1;
            vkTris.vertexData.deviceAddress = pVB->GetVkDeviceAddress() + SrcTris.VertexOffset;

            // geometry.triangles.vertexData.deviceAddress must be aligned to the size in bytes of the smallest component of the format in vertexFormat
            VERIFY(vkTris.vertexData.deviceAddress % GetValueSize(TriDesc.VertexValueType) == 0, "Vertex buffer start address is not properly aligned");

            TransitionOrVerifyBufferState(*pVB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

            if (SrcTris.pIndexBuffer)
            {
                BufferVkImpl* const pIB = ClassPtrCast<BufferVkImpl>(SrcTris.pIndexBuffer);

                // index type in SrcTris may be undefined, so use index type from description
                vkTris.indexType               = TypeToVkIndexType(TriDesc.IndexType);
                vkTris.indexData.deviceAddress = pIB->GetVkDeviceAddress() + SrcTris.IndexOffset;

                // geometry.triangles.indexData.deviceAddress must be aligned to the size in bytes of the type in indexType
                VERIFY(vkTris.indexData.deviceAddress % GetValueSize(TriDesc.IndexType) == 0, "Index buffer start address is not properly aligned");

                TransitionOrVerifyBufferState(*pIB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);
            }
            else
            {
                vkTris.indexType               = VK_INDEX_TYPE_NONE_KHR;
                vkTris.indexData.deviceAddress = 0;
            }

            if (SrcTris.pTransformBuffer)
            {
                BufferVkImpl* const pTB            = ClassPtrCast<BufferVkImpl>(SrcTris.pTransformBuffer);
                vkTris.transformData.deviceAddress = pTB->GetVkDeviceAddress() + SrcTris.TransformBufferOffset;

                // If geometry.triangles.transformData.deviceAddress is not 0, it must be aligned to 16 bytes
                VERIFY(vkTris.indexData.deviceAddress % 16 == 0, "Transform buffer start address is not properly aligned");

                TransitionOrVerifyBufferState(*pTB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);
            }
            else
            {
                vkTris.transformData.deviceAddress = 0;
            }

            off.primitiveCount  = SrcTris.PrimitiveCount;
            off.firstVertex     = 0;
            off.primitiveOffset = 0;
            off.transformOffset = 0;
        }
    }
    else if (Attribs.pBoxData != nullptr)
    {
        vkGeometries.resize(Attribs.BoxDataCount);
        vkRanges.resize(Attribs.BoxDataCount);
        pBLASVk->SetActualGeometryCount(Attribs.BoxDataCount);

        for (Uint32 i = 0; i < Attribs.BoxDataCount; ++i)
        {
            const BLASBuildBoundingBoxData& SrcBoxes = Attribs.pBoxData[i];

            Uint32 Idx    = i;
            Uint32 GeoIdx = pBLASVk->UpdateGeometryIndex(SrcBoxes.GeometryName, Idx, Attribs.Update);

            if (GeoIdx == INVALID_INDEX || Idx == INVALID_INDEX)
            {
                UNEXPECTED("Failed to find geometry by name");
                continue;
            }

            VkAccelerationStructureGeometryKHR&          vkGeo   = vkGeometries[Idx];
            VkAccelerationStructureGeometryAabbsDataKHR& vkAABBs = vkGeo.geometry.aabbs;
            VkAccelerationStructureBuildRangeInfoKHR&    off     = vkRanges[Idx];

            vkGeo.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
            vkGeo.pNext        = nullptr;
            vkGeo.flags        = GeometryFlagsToVkGeometryFlags(SrcBoxes.Flags);
            vkGeo.geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;

            BufferVkImpl* const pBB    = ClassPtrCast<BufferVkImpl>(SrcBoxes.pBoxBuffer);
            vkAABBs.sType              = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
            vkAABBs.pNext              = nullptr;
            vkAABBs.stride             = SrcBoxes.BoxStride;
            vkAABBs.data.deviceAddress = pBB->GetVkDeviceAddress() + SrcBoxes.BoxOffset;

            // geometry.aabbs.data.deviceAddress must be aligned to 8 bytes
            VERIFY(vkAABBs.data.deviceAddress % 8 == 0, "AABB start address is not properly aligned");

            TransitionOrVerifyBufferState(*pBB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

            off.firstVertex     = 0;
            off.transformOffset = 0;
            off.primitiveOffset = 0;
            off.primitiveCount  = SrcBoxes.BoxCount;
        }
    }

    VkAccelerationStructureBuildRangeInfoKHR const* VkRangePtr = vkRanges.data();

    vkASBuildInfo.sType                     = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    vkASBuildInfo.type                      = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;                 // type must be compatible with create info
    vkASBuildInfo.flags                     = BuildASFlagsToVkBuildAccelerationStructureFlags(BLASDesc.Flags); // flags must be compatible with create info
    vkASBuildInfo.mode                      = Attribs.Update ? VK_BUILD_ACCELERATION_STRUCTURE_MODE_UPDATE_KHR : VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkASBuildInfo.srcAccelerationStructure  = Attribs.Update ? pBLASVk->GetVkBLAS() : VK_NULL_HANDLE;
    vkASBuildInfo.dstAccelerationStructure  = pBLASVk->GetVkBLAS();
    vkASBuildInfo.geometryCount             = static_cast<uint32_t>(vkGeometries.size());
    vkASBuildInfo.pGeometries               = vkGeometries.data();
    vkASBuildInfo.ppGeometries              = nullptr;
    vkASBuildInfo.scratchData.deviceAddress = pScratchVk->GetVkDeviceAddress() + Attribs.ScratchBufferOffset;

    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits = m_pDevice->GetPhysicalDevice().GetExtProperties().AccelStruct;
    VERIFY(vkASBuildInfo.scratchData.deviceAddress % ASLimits.minAccelerationStructureScratchOffsetAlignment == 0, "Scratch buffer start address is not properly aligned");

    EnsureVkCmdBuffer();
    m_CommandBuffer.BuildAccelerationStructure(1, &vkASBuildInfo, &VkRangePtr);
    ++m_State.NumCommands;

#ifdef DILIGENT_DEVELOPMENT
    pBLASVk->DvpUpdateVersion();
#endif
}